

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::FocusableItemRegister(ImGuiWindow *window,ImGuiID id)

{
  int *piVar1;
  uint uVar2;
  ImGuiID IVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  ImGuiContext *g;
  int iVar6;
  
  pIVar4 = GImGui;
  uVar2 = (window->DC).ItemFlags;
  iVar6 = (window->DC).FocusCounterAll + 1;
  (window->DC).FocusCounterAll = iVar6;
  if ((uVar2 & 5) == 0) {
    piVar1 = &(window->DC).FocusCounterTab;
    *piVar1 = *piVar1 + 1;
  }
  IVar3 = pIVar4->ActiveId;
  if ((((IVar3 == id) && (pIVar4->FocusTabPressed == true)) &&
      ((pIVar4->ActiveIdBlockNavInputFlags & 0x20000) == 0)) &&
     (pIVar4->FocusRequestNextWindow == (ImGuiWindow *)0x0)) {
    pIVar4->FocusRequestNextWindow = window;
    iVar5 = 1;
    if ((pIVar4->IO).KeyShift != false) {
      iVar5 = -(uint)((uVar2 & 5) == 0);
    }
    pIVar4->FocusRequestNextCounterTab = iVar5 + (window->DC).FocusCounterTab;
  }
  if (pIVar4->FocusRequestCurrWindow == window) {
    if (iVar6 == pIVar4->FocusRequestCurrCounterAll) {
      return true;
    }
    if (((uVar2 & 5) == 0) && ((window->DC).FocusCounterTab == pIVar4->FocusRequestCurrCounterTab))
    {
      pIVar4->NavJustTabbedId = id;
      return true;
    }
    if (IVar3 == id) {
      pIVar4->ActiveIdIsJustActivated = IVar3 != 0;
      if (IVar3 != 0) {
        pIVar4->ActiveIdTimer = 0.0;
        pIVar4->ActiveIdHasBeenPressedBefore = false;
        pIVar4->ActiveIdHasBeenEditedBefore = false;
      }
      pIVar4->ActiveId = 0;
      pIVar4->ActiveIdAllowNavDirFlags = 0;
      pIVar4->ActiveIdBlockNavInputFlags = 0;
      pIVar4->ActiveIdAllowOverlap = false;
      pIVar4->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar4->ActiveIdHasBeenEditedThisFrame = false;
      return false;
    }
  }
  return false;
}

Assistant:

bool ImGui::FocusableItemRegister(ImGuiWindow* window, ImGuiID id)
{
    ImGuiContext& g = *GImGui;

    // Increment counters
    const bool is_tab_stop = (window->DC.ItemFlags & (ImGuiItemFlags_NoTabStop | ImGuiItemFlags_Disabled)) == 0;
    window->DC.FocusCounterAll++;
    if (is_tab_stop)
        window->DC.FocusCounterTab++;

    // Process TAB/Shift-TAB to tab *OUT* of the currently focused item.
    // (Note that we can always TAB out of a widget that doesn't allow tabbing in)
    if (g.ActiveId == id && g.FocusTabPressed && !(g.ActiveIdBlockNavInputFlags & (1 << ImGuiNavInput_KeyTab_)) && g.FocusRequestNextWindow == NULL)
    {
        g.FocusRequestNextWindow = window;
        g.FocusRequestNextCounterTab = window->DC.FocusCounterTab + (g.IO.KeyShift ? (is_tab_stop ? -1 : 0) : +1); // Modulo on index will be applied at the end of frame once we've got the total counter of items.
    }

    // Handle focus requests
    if (g.FocusRequestCurrWindow == window)
    {
        if (window->DC.FocusCounterAll == g.FocusRequestCurrCounterAll)
            return true;
        if (is_tab_stop && window->DC.FocusCounterTab == g.FocusRequestCurrCounterTab)
        {
            g.NavJustTabbedId = id;
            return true;
        }

        // If another item is about to be focused, we clear our own active id
        if (g.ActiveId == id)
            ClearActiveID();
    }

    return false;
}